

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_texm3x3(Context *ctx,char *opcode,int dims)

{
  bool bVar1;
  uint uVar2;
  RegisterList *pRVar3;
  RegisterList *pRVar4;
  uint uVar5;
  
  uVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    uVar2 = (uint)ctx->minor_ver;
  }
  if (0x10003 < (uVar2 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s opcode not available after Shader Model 1.3",opcode);
  }
  if (ctx->texm3x3pad_dst1 == -1) {
    failf(ctx,"%s opcode without matching TEXM3X3PADs",opcode);
  }
  pRVar3 = (RegisterList *)0x0;
  state_texops(ctx,opcode,dims,0);
  ctx->reset_texmpad = 1;
  uVar2 = (ctx->dest_arg).regnum | 0xa0000;
  pRVar4 = (ctx->samplers).next;
  do {
    if (pRVar4 == (RegisterList *)0x0) {
      pRVar3 = (RegisterList *)0x0;
      break;
    }
    uVar5 = pRVar4->regtype << 0x10 | pRVar4->regnum;
    if (uVar2 == uVar5) {
      bVar1 = false;
      pRVar3 = pRVar4;
    }
    else if (uVar2 < uVar5) {
      pRVar3 = (RegisterList *)0x0;
      bVar1 = false;
    }
    else {
      pRVar4 = pRVar4->next;
      bVar1 = true;
    }
  } while (bVar1);
  if ((pRVar3 != (RegisterList *)0x0) && (0xfffffffd < pRVar3->index - 5)) {
    return;
  }
  failf(ctx,"%s needs a 3D or Cubemap sampler",opcode);
  return;
}

Assistant:

static void state_texm3x3(Context *ctx, const char *opcode, const int dims)
{
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    if (shader_version_atleast(ctx, 1, 4))
        failf(ctx, "%s opcode not available after Shader Model 1.3", opcode);
    if (ctx->texm3x3pad_dst1 == -1)
        failf(ctx, "%s opcode without matching TEXM3X3PADs", opcode);
    state_texops(ctx, opcode, dims, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if ((ttype != TEXTURE_TYPE_VOLUME) && (ttype != TEXTURE_TYPE_CUBE))
        failf(ctx, "%s needs a 3D or Cubemap sampler", opcode);
}